

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall
ktx::ValidationContext::
error<unsigned_int&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,std::__cxx11::string&,int,unsigned_char&,int,int,int,int,int,int>
          (ValidationContext *this,IssueError *issue,uint *args,uchar *args_1,uchar *args_2,
          uchar *args_3,uchar *args_4,uchar *args_5,uchar *args_6,uchar *args_7,uchar *args_8,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9,int *args_10,
          uchar *args_11,int *args_12,int *args_13,int *args_14,int *args_15,int *args_16,
          int *args_17)

{
  char *pcVar1;
  string_view fmt;
  format_args args_18;
  undefined1 local_2c0 [8];
  _Alloc_hider local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  string local_298;
  ulong local_278 [2];
  undefined4 local_268;
  ulong local_258;
  undefined4 local_248;
  ulong local_238;
  undefined4 local_228;
  ulong local_218;
  undefined4 local_208;
  ulong local_1f8;
  undefined4 local_1e8;
  ulong local_1d8;
  undefined4 local_1c8;
  ulong local_1b8;
  undefined4 local_1a8;
  ulong local_198;
  undefined4 local_188;
  ulong local_178;
  undefined4 local_168;
  pointer local_158;
  size_type sStack_150;
  undefined4 local_148;
  ulong local_138;
  undefined4 local_128;
  ulong local_118;
  undefined4 local_108;
  ulong local_f8;
  undefined4 local_e8;
  ulong local_d8;
  undefined4 local_c8;
  ulong local_b8;
  undefined4 local_a8;
  ulong local_98;
  undefined4 local_88;
  ulong local_78;
  undefined4 local_68;
  ulong local_58;
  undefined4 local_48;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_2c0[0] = (issue->super_Issue).type;
  local_2c0._2_2_ = (issue->super_Issue).id;
  pcVar1 = (issue->super_Issue).message._M_str;
  local_2b8._M_p = (pointer)&local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,pcVar1,pcVar1 + (issue->super_Issue).message._M_len);
  local_158 = (args_9->_M_dataplus)._M_p;
  sStack_150 = args_9->_M_string_length;
  local_278[0] = (ulong)*args;
  local_258 = (ulong)*args_1;
  local_238 = (ulong)*args_2;
  local_218 = (ulong)*args_3;
  local_1f8 = (ulong)*args_4;
  local_1d8 = (ulong)*args_5;
  local_1b8 = (ulong)*args_6;
  local_198 = (ulong)*args_7;
  local_178 = (ulong)*args_8;
  local_138 = (ulong)(uint)*args_10;
  local_118 = (ulong)*args_11;
  local_f8 = (ulong)(uint)*args_12;
  local_d8 = (ulong)(uint)*args_13;
  local_b8 = (ulong)(uint)*args_14;
  local_98 = (ulong)(uint)*args_15;
  local_78 = (ulong)(uint)*args_16;
  local_58 = (ulong)(uint)*args_17;
  local_268 = 2;
  local_248 = 2;
  local_228 = 2;
  local_208 = 2;
  local_1e8 = 2;
  local_1c8 = 2;
  local_1a8 = 2;
  local_188 = 2;
  local_168 = 2;
  local_148 = 0xd;
  local_128 = 1;
  local_108 = 2;
  local_e8 = 1;
  local_c8 = 1;
  local_a8 = 1;
  local_88 = 1;
  local_68 = 1;
  local_48 = 1;
  fmt.size_ = 0x8000000000000012;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args_18.field_1._0_4_ = *args_14;
  args_18.desc_ = (unsigned_long_long)local_278;
  args_18.field_1._4_4_ = 0;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_298,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_18);
  if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->callback)._M_invoker)((_Any_data *)&this->callback,(ValidationReport *)local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_p != &local_2a8) {
      operator_delete(local_2b8._M_p,local_2a8._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }